

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_mem.cpp
# Opt level: O0

void mpp_osal_free(char *caller,void *ptr)

{
  uint uVar1;
  MppMemService *this;
  void *ret_00;
  int iVar2;
  void *ptr_real;
  void *ret;
  AutoMutex auto_lock;
  size_t size;
  RK_U32 debug;
  MppMemService *srv;
  void *ptr_local;
  char *caller_local;
  
  this = MppMemService::get_inst();
  uVar1 = this->debug;
  if (ptr != (void *)0x0) {
    if (uVar1 == 0) {
      os_free(ptr);
    }
    else {
      auto_lock.mLock = (Mutex *)0x0;
      Mutex::Autolock::Autolock((Autolock *)&ret,this->m_lock,1);
      if ((uVar1 & 0x20) == 0) {
        iVar2 = 0;
        if ((uVar1 & 0x10) != 0) {
          iVar2 = 0x20;
        }
        MppMemService::del_node(this,caller,ptr,(size_t *)&auto_lock.mLock);
        MppMemService::chk_mem(this,caller,ptr,(size_t)auto_lock.mLock);
        os_free((void *)((long)ptr - (long)iVar2));
        MppMemService::add_log
                  (this,MEM_FREE,caller,ptr,(void *)((long)ptr - (long)iVar2),
                   (size_t)auto_lock.mLock,0);
      }
      else {
        ret_00 = MppMemService::delay_del_node(this,caller,ptr,(size_t *)&auto_lock.mLock);
        if (ret_00 != (void *)0x0) {
          os_free((void *)((long)ret_00 + -0x20));
        }
        MppMemService::add_log(this,MEM_FREE_DELAY,caller,ptr,ret_00,(size_t)auto_lock.mLock,0);
      }
      Mutex::Autolock::~Autolock((Autolock *)&ret);
    }
  }
  return;
}

Assistant:

void mpp_osal_free(const char *caller, void *ptr)
{
    MppMemService *srv = MppMemService::get_inst();
    RK_U32 debug = srv->debug;

    if (NULL == ptr)
        return;

    if (!debug) {
        os_free(ptr);
        return ;
    }

    size_t size = 0;

    AutoMutex auto_lock(srv->m_lock);
    if (debug & MEM_POISON) {
        // NODE: keep this node and  delete delay node
        void *ret = srv->delay_del_node(caller, ptr, &size);
        if (ret)
            os_free((RK_U8 *)ret - MEM_ALIGN);

        srv->add_log(MEM_FREE_DELAY, caller, ptr, ret, size, 0);
    } else {
        void *ptr_real = (RK_U8 *)ptr - MEM_HEAD_ROOM(debug);
        // NODE: delete node and return size here
        srv->del_node(caller, ptr, &size);
        srv->chk_mem(caller, ptr, size);
        os_free(ptr_real);
        srv->add_log(MEM_FREE, caller, ptr, ptr_real, size, 0);
    }
}